

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitCommon.c
# Opt level: O0

void sysbvm_jit_dwarfLineInfoEmissionState_addSourceCode
               (sysbvm_jit_dwarfLineInfoEmissionState_t *state,sysbvm_tuple_t sourceCode)

{
  _Bool _Var1;
  int iVar2;
  sysbvm_sourceCode_t *sourceCodeObject;
  sysbvm_tuple_t sourceCode_local;
  sysbvm_jit_dwarfLineInfoEmissionState_t *state_local;
  
  _Var1 = sysbvm_tuple_isNonNullPointer(sourceCode);
  if ((_Var1) &&
     (iVar2 = sysbvm_jit_dwarfLineInfoEmissionState_indexOfFile(state,sourceCode), iVar2 == 0)) {
    sysbvm_jit_dwarfLineInfoEmissionState_addDirectory(state,*(sysbvm_tuple_t *)(sourceCode + 0x18))
    ;
    iVar2 = state->fileCount;
    state->fileCount = iVar2 + 1;
    state->files[iVar2] = sourceCode;
  }
  return;
}

Assistant:

void sysbvm_jit_dwarfLineInfoEmissionState_addSourceCode(sysbvm_jit_dwarfLineInfoEmissionState_t *state, sysbvm_tuple_t sourceCode)
{
    if(!sysbvm_tuple_isNonNullPointer(sourceCode))
        return;

    if(!sysbvm_jit_dwarfLineInfoEmissionState_indexOfFile(state, sourceCode))
    {
        sysbvm_sourceCode_t *sourceCodeObject = (sysbvm_sourceCode_t*)sourceCode;
        sysbvm_jit_dwarfLineInfoEmissionState_addDirectory(state, sourceCodeObject->directory);

        state->files[state->fileCount++] = sourceCode;
    }
}